

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

CURLcode ossl_connect_common(Curl_cfilter *cf,Curl_easy *data,_Bool nonblocking,_Bool *done)

{
  byte bVar1;
  byte bVar2;
  undefined8 *puVar3;
  long *plVar4;
  connectdata *conn;
  curl_blob *pcVar5;
  ulong uVar6;
  _Bool _Var7;
  curl_socket_t cVar8;
  int iVar9;
  CURLcode CVar10;
  uint uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  int iVar14;
  timediff_t tVar15;
  ssl_config_data *psVar16;
  long lVar17;
  char *pcVar18;
  char *pcVar19;
  SSL_CIPHER *c;
  char *pcVar20;
  char *pcVar21;
  SSL_METHOD *meth;
  SSL_CTX *pSVar22;
  ssl_primary_config *psVar23;
  ssl_primary_config *psVar24;
  BIO_METHOD *pBVar25;
  BIO *pBVar26;
  X509 *pXVar27;
  X509_NAME *pXVar28;
  ASN1_TIME *pAVar29;
  uint *puVar30;
  ulong uVar31;
  long lVar32;
  stack_st_X509 *psVar33;
  undefined8 uVar34;
  OCSP_RESPONSE *resp;
  int *piVar35;
  int *piVar36;
  X509_PUBKEY *pXVar37;
  uchar *pubkey;
  SSL *pSVar38;
  OCSP_BASICRESP *bs;
  X509_STORE *st;
  X509 *issuer;
  EVP_MD *dgst;
  OCSP_CERTID *id;
  curl_socket_t writefd;
  size_t size;
  size_t size_00;
  curl_socket_t readfd0;
  void *pvVar39;
  uint uVar40;
  curl_blob *in_stack_fffffffffffff538;
  CURLcode local_a84;
  int cert_status;
  void *local_a58;
  int crl_reason;
  char *ptr;
  ASN1_OBJECT *paobj_cert;
  X509_ALGOR *palg_cert;
  _Bool *local_a30;
  void *ssl_sessionid;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  char group_name_final [80];
  ASN1_GENERALIZEDTIME *rev;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  int psigtype_nid;
  uchar uStack_934;
  uchar uStack_933;
  uchar uStack_932;
  uchar uStack_931;
  uchar auStack_930 [28];
  int iStack_914;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  char error_buffer [256];
  
  piVar36 = (int *)cf->ctx;
  cVar8 = Curl_conn_cf_get_socket(cf,data);
  if (*piVar36 == 2) {
    *done = true;
    return CURLE_OK;
  }
  local_a30 = done;
  if (piVar36[1] == 0) {
    tVar15 = Curl_timeleft(data,(curltime *)0x0,true);
    if (tVar15 < 0) {
LAB_00529d36:
      Curl_failf(data,"SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }
    pvVar39 = cf->ctx;
    ssl_sessionid = (void *)0x0;
    psVar24 = Curl_ssl_cf_get_primary_config(cf);
    psVar16 = Curl_ssl_cf_get_config(cf,data);
    bVar2 = psVar24->version;
    uVar11 = (uint)bVar2;
    pcVar18 = (psVar16->primary).clientcert;
    pcVar5 = (psVar16->primary).cert_blob;
    pcVar19 = psVar16->cert_type;
    bVar1 = psVar24->field_0x69;
    plVar4 = *(long **)((long)pvVar39 + 0x30);
    CVar10 = ossl_seed(data);
    if (CVar10 != CURLE_OK) {
      return CVar10;
    }
    psVar16->certverifyresult = 1;
    local_a58 = pvVar39;
    if (7 < uVar11) {
      pcVar18 = "Unrecognized parameter passed via CURLOPT_SSLVERSION";
      goto LAB_0052a692;
    }
    if ((0xf3U >> (uVar11 & 0x1f) & 1) == 0) {
      if (uVar11 == 2) {
        pcVar18 = "No SSLv2 support";
      }
      else {
        pcVar18 = "No SSLv3 support";
      }
      Curl_failf(data,pcVar18);
      return CURLE_NOT_BUILT_IN;
    }
    meth = (SSL_METHOD *)TLS_client_method();
    if (*plVar4 != 0) {
      ossl_close(cf,data);
    }
    pSVar22 = SSL_CTX_new(meth);
    *plVar4 = (long)pSVar22;
    if (pSVar22 == (SSL_CTX *)0x0) {
      uVar31 = ERR_peek_error();
      pcVar18 = ossl_strerror(uVar31,error_buffer,0x100);
      pcVar19 = "SSL: couldn\'t create a context: %s";
      goto LAB_0052a029;
    }
    SSL_CTX_ctrl(pSVar22,0x21,0x10,(void *)0x0);
    if (((data->set).fdebug != (curl_debug_callback)0x0) && (((data->set).field_0x8bd & 0x10) != 0))
    {
      SSL_CTX_set_msg_callback((SSL_CTX *)*plVar4,ossl_trace);
      SSL_CTX_ctrl((SSL_CTX *)*plVar4,0x10,0,cf);
    }
    uVar34 = 0x82024850;
    if ((psVar16->field_0xb0 & 4) == 0) {
      uVar34 = 0x82024050;
    }
    if ((bVar2 & 0xfe) == 2) {
      return CURLE_NOT_BUILT_IN;
    }
    pSVar22 = (SSL_CTX *)*plVar4;
    psVar23 = Curl_ssl_cf_get_primary_config(cf);
    switch(psVar23->version) {
    case '\0':
      goto switchD_00529d2a_caseD_0;
    case '\x01':
    case '\x04':
      lVar17 = 0x301;
      break;
    default:
      lVar17 = 0;
      break;
    case '\x05':
      lVar17 = 0x302;
      break;
    case '\x06':
      lVar17 = 0x303;
      break;
    case '\a':
      lVar17 = 0x304;
    }
    lVar17 = SSL_CTX_ctrl(pSVar22,0x7b,lVar17,(void *)0x0);
    if (lVar17 == 0) {
      return CURLE_SSL_CONNECT_ERROR;
    }
switchD_00529d2a_caseD_0:
    uVar31 = (ulong)psVar23->version_max << 0x30;
    uVar6 = (ulong)(psVar23->version_max >> 0x10);
    lVar17 = (uVar31 | uVar6) + 0x2fd;
    if ((uVar31 | uVar6 & 0xffff00000000fffc) != 4) {
      lVar17 = 0;
    }
    lVar17 = SSL_CTX_ctrl(pSVar22,0x7c,lVar17,(void *)0x0);
    if (lVar17 == 0) {
      return CURLE_SSL_CONNECT_ERROR;
    }
    SSL_CTX_set_options(*plVar4,uVar34);
    pvVar39 = local_a58;
    if (*(alpn_spec **)((long)local_a58 + 0x28) != (alpn_spec *)0x0) {
      CVar10 = Curl_alpn_to_proto_buf
                         ((alpn_proto_buf *)&psigtype_nid,*(alpn_spec **)((long)local_a58 + 0x28));
      if ((CVar10 != CURLE_OK) ||
         (iVar9 = SSL_CTX_set_alpn_protos(*plVar4,&psigtype_nid,iStack_914), iVar9 != 0)) {
        pcVar18 = "Error setting ALPN";
        goto LAB_0052a692;
      }
      Curl_alpn_to_proto_str((alpn_proto_buf *)&psigtype_nid,*(alpn_spec **)((long)pvVar39 + 0x28));
      if (((data->set).field_0x8bd & 0x10) != 0) {
        Curl_infof(data,"ALPN: curl offers %s",&psigtype_nid);
      }
    }
    if ((pcVar18 != (char *)0x0 || pcVar5 != (curl_blob *)0x0) || pcVar19 != (char *)0x0) {
      in_stack_fffffffffffff538 = psVar16->key_blob;
      iVar9 = cert_stuff(data,(SSL_CTX *)*plVar4,pcVar18,pcVar5,pcVar19,psVar16->key,
                         in_stack_fffffffffffff538,psVar16->key_type,psVar16->key_passwd);
      if (iVar9 == 0) {
        return CURLE_SSL_CERTPROBLEM;
      }
    }
    pcVar18 = psVar24->cipher_list;
    if (pcVar18 != (char *)0x0) {
      iVar9 = SSL_CTX_set_cipher_list((SSL_CTX *)*plVar4,pcVar18);
      if (iVar9 == 0) {
        pcVar19 = "failed setting cipher list: %s";
        goto LAB_0052b16d;
      }
      if (((data->set).field_0x8bd & 0x10) != 0) {
        Curl_infof(data,"Cipher selection: %s",pcVar18);
      }
    }
    pcVar18 = psVar24->cipher_list13;
    if (pcVar18 != (char *)0x0) {
      iVar9 = SSL_CTX_set_ciphersuites(*plVar4,pcVar18);
      if (iVar9 == 0) {
        pcVar19 = "failed setting TLS 1.3 cipher suite: %s";
        goto LAB_0052b16d;
      }
      if (((data->set).field_0x8bd & 0x10) != 0) {
        Curl_infof(data,"TLS 1.3 cipher selection: %s",pcVar18);
      }
    }
    SSL_CTX_set_post_handshake_auth(*plVar4,1);
    pcVar18 = psVar24->curves;
    if ((pcVar18 != (char *)0x0) &&
       (lVar17 = SSL_CTX_ctrl((SSL_CTX *)*plVar4,0x5c,0,pcVar18), lVar17 == 0)) {
      pcVar19 = "failed setting curves list: \'%s\'";
LAB_0052b16d:
      Curl_failf(data,pcVar19,pcVar18);
      return CURLE_SSL_CIPHER;
    }
    SSL_CTX_set_verify((SSL_CTX *)*plVar4,bVar1 & 1,(callback *)0x0);
    _Var7 = Curl_tls_keylog_enabled();
    if (_Var7) {
      SSL_CTX_set_keylog_callback(*plVar4,ossl_keylog_callback);
    }
    SSL_CTX_ctrl((SSL_CTX *)*plVar4,0x2c,0x301,(void *)0x0);
    SSL_CTX_sess_set_new_cb((SSL_CTX *)*plVar4,ossl_new_session_cb);
    if ((data->set).ssl.fsslctx != (curl_ssl_ctx_callback)0x0) {
      if (*(char *)((long)plVar4 + 0x24) == '\0') {
        CVar10 = Curl_ssl_setup_x509_store(cf,data,(SSL_CTX *)*plVar4);
        if (CVar10 != CURLE_OK) {
          return CVar10;
        }
        *(undefined1 *)((long)plVar4 + 0x24) = 1;
      }
      Curl_set_in_callback(data,true);
      CVar10 = (*(data->set).ssl.fsslctx)(data,(void *)*plVar4,(data->set).ssl.fsslctxp);
      Curl_set_in_callback(data,false);
      if (CVar10 != CURLE_OK) {
        Curl_failf(data,"error signaled by ssl ctx callback");
        return CVar10;
      }
    }
    if ((SSL *)plVar4[1] != (SSL *)0x0) {
      SSL_free((SSL *)plVar4[1]);
    }
    pSVar38 = SSL_new((SSL_CTX *)*plVar4);
    pvVar39 = local_a58;
    plVar4[1] = (long)pSVar38;
    if (pSVar38 == (SSL *)0x0) {
      Curl_failf(data,"SSL: couldn\'t create a context (handle)");
      return CURLE_OUT_OF_MEMORY;
    }
    SSL_set_ex_data(pSVar38,0,cf);
    if ((psVar24->field_0x69 & 4) != 0) {
      SSL_ctrl((SSL *)plVar4[1],0x41,1,(void *)0x0);
    }
    SSL_set_connect_state((SSL *)plVar4[1]);
    plVar4[2] = 0;
    if ((*(void **)((long)pvVar39 + 0x18) != (void *)0x0) &&
       (lVar17 = SSL_ctrl((SSL *)plVar4[1],0x37,0,*(void **)((long)pvVar39 + 0x18)), lVar17 == 0)) {
      pcVar18 = "Failed set SNI";
LAB_0052a692:
      Curl_failf(data,pcVar18);
      return CURLE_SSL_CONNECT_ERROR;
    }
    SSL_set_ex_data((SSL *)plVar4[1],0,cf);
    *(byte *)((long)pvVar39 + 0x54) = *(byte *)((long)pvVar39 + 0x54) & 0xfd;
    if (((psVar16->primary).field_0x69 & 8) != 0) {
      Curl_ssl_sessionid_lock(data);
      _Var7 = Curl_ssl_getsessionid(cf,data,&ssl_sessionid,(size_t *)0x0);
      if (!_Var7) {
        iVar9 = SSL_set_session((SSL *)plVar4[1],(SSL_SESSION *)ssl_sessionid);
        if (iVar9 == 0) {
          Curl_ssl_sessionid_unlock(data);
          uVar31 = ERR_get_error();
          pcVar18 = ossl_strerror(uVar31,error_buffer,0x100);
          Curl_failf(data,"SSL: SSL_set_session failed: %s",pcVar18);
          return CURLE_SSL_CONNECT_ERROR;
        }
        if (((data->set).field_0x8bd & 0x10) != 0) {
          Curl_infof(data,"SSL reusing session ID");
        }
        *(byte *)((long)local_a58 + 0x54) = *(byte *)((long)local_a58 + 0x54) | 2;
        pvVar39 = local_a58;
      }
      Curl_ssl_sessionid_unlock(data);
    }
    pBVar25 = (BIO_METHOD *)BIO_meth_new(0x401,"OpenSSL CF BIO");
    if (pBVar25 == (BIO_METHOD *)0x0) {
      plVar4[3] = 0;
      return CURLE_OUT_OF_MEMORY;
    }
    BIO_meth_set_write(pBVar25,ossl_bio_cf_out_write);
    BIO_meth_set_read(pBVar25,ossl_bio_cf_in_read);
    BIO_meth_set_ctrl(pBVar25,ossl_bio_cf_ctrl);
    BIO_meth_set_create(pBVar25,ossl_bio_cf_create);
    BIO_meth_set_destroy(pBVar25,ossl_bio_cf_destroy);
    plVar4[3] = (long)pBVar25;
    pBVar26 = BIO_new(pBVar25);
    if (pBVar26 == (BIO *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    BIO_set_data(pBVar26,cf);
    SSL_set_bio((SSL *)plVar4[1],pBVar26,pBVar26);
    *(undefined4 *)((long)pvVar39 + 4) = 1;
  }
  while (iVar9 = piVar36[1], iVar9 - 1U < 3) {
    tVar15 = Curl_timeleft(data,(curltime *)0x0,true);
    if (tVar15 < 0) goto LAB_00529d36;
    if ((!nonblocking) && (uVar11 = piVar36[1], (uVar11 & 0xfffffffe) == 2)) {
      writefd = -1;
      if (uVar11 == 3) {
        writefd = cVar8;
      }
      readfd0 = -1;
      if (uVar11 == 2) {
        readfd0 = cVar8;
      }
      iVar9 = Curl_socket_check(readfd0,-1,writefd,tVar15);
      if (iVar9 < 0) {
        puVar30 = (uint *)__errno_location();
        Curl_failf(data,"select/poll on SSL socket, errno: %d",(ulong)*puVar30);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if (iVar9 == 0) goto LAB_00529d36;
    }
    pvVar39 = cf->ctx;
    puVar3 = *(undefined8 **)((long)pvVar39 + 0x30);
    psVar16 = Curl_ssl_cf_get_config(cf,data);
    ERR_clear_error();
    iVar9 = SSL_connect((SSL *)puVar3[1]);
    if (*(char *)((long)puVar3 + 0x24) == '\0') {
      CVar10 = Curl_ssl_setup_x509_store(cf,data,(SSL_CTX *)*puVar3);
      if (CVar10 != CURLE_OK) {
        return CVar10;
      }
      *(undefined1 *)((long)puVar3 + 0x24) = 1;
    }
    if (iVar9 == 1) {
      _psigtype_nid = _psigtype_nid & 0xffffffff00000000;
      *(undefined4 *)((long)pvVar39 + 4) = 4;
      SSL_get_peer_signature_type_nid(puVar3[1],&psigtype_nid);
      lVar17 = SSL_ctrl((SSL *)puVar3[1],0x86,0,(void *)0x0);
      pcVar18 = OBJ_nid2sn((uint)lVar17 & 0xffff);
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
        pcVar19 = SSL_get_version((SSL *)puVar3[1]);
        c = SSL_get_current_cipher((SSL *)puVar3[1]);
        pcVar20 = SSL_CIPHER_get_name(c);
        if (pcVar18 == (char *)0x0) {
          pcVar18 = "[blank]";
        }
        pcVar21 = OBJ_nid2sn(psigtype_nid);
        Curl_infof(data,"SSL connection using %s / %s / %s / %s",pcVar19,pcVar20,pcVar18,pcVar21);
      }
      if (*(long *)((long)pvVar39 + 0x28) != 0) {
        SSL_get0_alpn_selected(puVar3[1],error_buffer,&ssl_sessionid);
        CVar10 = Curl_alpn_set_negotiated
                           (cf,data,(uchar *)error_buffer._0_8_,(ulong)ssl_sessionid & 0xffffffff);
        if (CVar10 != CURLE_OK) {
          return CVar10;
        }
      }
    }
    else {
      iVar9 = SSL_get_error((SSL *)puVar3[1],iVar9);
      if (iVar9 == 0xc) {
LAB_00529b3a:
        *(undefined4 *)((long)pvVar39 + 4) = 1;
      }
      else if (iVar9 == 3) {
        *(undefined4 *)((long)pvVar39 + 4) = 3;
      }
      else {
        if (iVar9 == 9) goto LAB_00529b3a;
        if (iVar9 == 2) {
          *(undefined4 *)((long)pvVar39 + 4) = 2;
        }
        else if (*(int *)(puVar3 + 4) != 0x51) {
          memset(error_buffer,0,0x100);
          *(undefined4 *)((long)pvVar39 + 4) = 1;
          uVar31 = ERR_get_error();
          uVar11 = (uint)uVar31;
          if ((uVar11 & 0xff800000) == 0xa000000 && -1 < (int)uVar11) {
            uVar11 = uVar11 & 0x7fffff;
            if (uVar11 != 0x86) {
              if (uVar11 == 0x45c) {
                ossl_strerror(uVar31,error_buffer,0x100);
                CVar10 = CURLE_SSL_CLIENTCERT;
                goto LAB_0052a76f;
              }
              if (uVar11 != 0x415) goto LAB_0052a18f;
            }
            lVar17 = SSL_get_verify_result((SSL *)puVar3[1]);
            if (lVar17 == 0) {
              builtin_strncpy(error_buffer,"SSL certificate verification failed",0x24);
            }
            else {
              psVar16->certverifyresult = lVar17;
              pcVar18 = X509_verify_cert_error_string(lVar17);
              curl_msnprintf(error_buffer,0x100,"SSL certificate problem: %s",pcVar18);
            }
            CVar10 = CURLE_PEER_FAILED_VERIFICATION;
LAB_0052a76f:
            Curl_failf(data,"%s",error_buffer);
            return CVar10;
          }
LAB_0052a18f:
          ossl_strerror(uVar31,error_buffer,0x100);
          if (uVar31 != 0) {
            CVar10 = CURLE_SSL_CONNECT_ERROR;
            goto LAB_0052a76f;
          }
          local_8f8 = 0;
          uStack_8f0 = 0;
          local_908 = 0;
          uStack_900 = 0;
          auStack_930[0x18] = '\0';
          auStack_930._25_3_ = 0;
          iStack_914 = 0;
          uStack_910 = 0;
          auStack_930[8] = '\0';
          auStack_930[9] = '\0';
          auStack_930[10] = '\0';
          auStack_930[0xb] = '\0';
          auStack_930[0xc] = '\0';
          auStack_930[0xd] = '\0';
          auStack_930[0xe] = '\0';
          auStack_930[0xf] = '\0';
          auStack_930[0x10] = '\0';
          auStack_930[0x11] = '\0';
          auStack_930[0x12] = '\0';
          auStack_930[0x13] = '\0';
          auStack_930[0x14] = '\0';
          auStack_930[0x15] = '\0';
          auStack_930[0x16] = '\0';
          auStack_930[0x17] = '\0';
          psigtype_nid._0_1_ = '\0';
          psigtype_nid._1_1_ = '\0';
          psigtype_nid._2_1_ = '\0';
          psigtype_nid._3_1_ = '\0';
          uStack_934 = '\0';
          uStack_933 = '\0';
          uStack_932 = '\0';
          uStack_931 = '\0';
          auStack_930[0] = '\0';
          auStack_930[1] = '\0';
          auStack_930[2] = '\0';
          auStack_930[3] = '\0';
          auStack_930[4] = '\0';
          auStack_930[5] = '\0';
          auStack_930[6] = '\0';
          auStack_930[7] = '\0';
          piVar35 = __errno_location();
          piVar36 = &psigtype_nid;
          if (iVar9 == 5 && *piVar35 != 0) {
            Curl_strerror(*piVar35,(char *)piVar36,0x50);
            if ((uchar)psigtype_nid != '\0') goto LAB_0052a5a8;
          }
          piVar36 = (int *)SSL_ERROR_to_str(iVar9);
LAB_0052a5a8:
          Curl_failf(data,"OpenSSL SSL_connect: %s in connection to %s:%d ",piVar36,
                     *(undefined8 *)((long)pvVar39 + 8),(ulong)*(uint *)((long)pvVar39 + 0x50));
          return CURLE_SSL_CONNECT_ERROR;
        }
      }
    }
    if ((nonblocking) && (piVar36[1] - 1U < 3)) {
      return CURLE_OK;
    }
  }
  if (iVar9 == 4) {
    local_a58 = cf->ctx;
    psVar24 = Curl_ssl_cf_get_primary_config(cf);
    bVar2 = psVar24->field_0x69;
    pvVar39 = cf->ctx;
    conn = cf->conn;
    psVar16 = Curl_ssl_cf_get_config(cf,data);
    psVar24 = Curl_ssl_cf_get_primary_config(cf);
    memset(&psigtype_nid,0,0x100);
    pBVar25 = BIO_s_mem();
    pBVar26 = BIO_new(pBVar25);
    if (pBVar26 == (BIO *)0x0) {
      uVar31 = ERR_get_error();
      pcVar18 = ossl_strerror(uVar31,(char *)&psigtype_nid,0x100);
      pcVar19 = "BIO_new return NULL, OpenSSL error %s";
LAB_0052a029:
      Curl_failf(data,pcVar19,pcVar18);
      return CURLE_OUT_OF_MEMORY;
    }
    lVar17 = *(long *)((long)pvVar39 + 0x30);
    if (((data->set).ssl.field_0xb0 & 1) != 0) {
      Curl_ossl_certchain(data,*(SSL **)(lVar17 + 8));
    }
    pXVar27 = (X509 *)SSL_get1_peer_certificate(*(undefined8 *)(lVar17 + 8));
    *(X509 **)(lVar17 + 0x10) = pXVar27;
    if (pXVar27 == (X509 *)0x0) {
      BIO_free(pBVar26);
      if ((bVar2 & 3) != 0) {
        Curl_failf(data,"SSL: couldn\'t get peer certificate");
        return CURLE_PEER_FAILED_VERIFICATION;
      }
    }
    else {
      if (((data->set).field_0x8bd & 0x10) != 0) {
        _Var7 = Curl_ssl_cf_is_proxy(cf);
        pcVar18 = "Server";
        if (_Var7) {
          pcVar18 = "Proxy";
        }
        Curl_infof(data,"%s certificate:",pcVar18);
        pXVar27 = *(X509 **)(lVar17 + 0x10);
      }
      pXVar28 = X509_get_subject_name(pXVar27);
      iVar9 = x509_name_oneline((X509_NAME *)pXVar28,error_buffer,size);
      if (((data->set).field_0x8bd & 0x10) != 0) {
        pcVar18 = "[NONE]";
        if (iVar9 == 0) {
          pcVar18 = error_buffer;
        }
        Curl_infof(data," subject: %s",pcVar18);
      }
      pAVar29 = (ASN1_TIME *)X509_get0_notBefore(*(undefined8 *)(lVar17 + 0x10));
      ASN1_TIME_print(pBVar26,pAVar29);
      uVar31 = BIO_ctrl(pBVar26,3,0,&ptr);
      if (((data->set).field_0x8bd & 0x10) != 0) {
        Curl_infof(data," start date: %.*s",uVar31 & 0xffffffff);
      }
      BIO_ctrl(pBVar26,1,0,(void *)0x0);
      pAVar29 = (ASN1_TIME *)X509_get0_notAfter(*(undefined8 *)(lVar17 + 0x10));
      ASN1_TIME_print(pBVar26,pAVar29);
      uVar31 = BIO_ctrl(pBVar26,3,0,&ptr);
      if (((data->set).field_0x8bd & 0x10) != 0) {
        Curl_infof(data," expire date: %.*s",uVar31 & 0xffffffff);
      }
      BIO_ctrl(pBVar26,1,0,(void *)0x0);
      BIO_free(pBVar26);
      if (((psVar24->field_0x69 & 2) != 0) &&
         (CVar10 = Curl_ossl_verifyhost
                             (data,conn,(ssl_peer *)((long)pvVar39 + 8),*(X509 **)(lVar17 + 0x10)),
         CVar10 != CURLE_OK)) {
        X509_free(*(X509 **)(lVar17 + 0x10));
        *(undefined8 *)(lVar17 + 0x10) = 0;
        return CVar10;
      }
      local_a84 = CURLE_PEER_FAILED_VERIFICATION;
      pXVar28 = X509_get_issuer_name(*(X509 **)(lVar17 + 0x10));
      iVar9 = x509_name_oneline((X509_NAME *)pXVar28,error_buffer,size_00);
      if (iVar9 == 0) {
        if (((data->set).field_0x8bd & 0x10) != 0) {
          Curl_infof(data," issuer: %s",error_buffer);
        }
        pcVar5 = psVar24->issuercert_blob;
        if (psVar24->issuercert != (char *)0x0) {
          if (pcVar5 != (curl_blob *)0x0) goto LAB_0052a6ae;
          pBVar25 = BIO_s_file();
          pBVar26 = BIO_new(pBVar25);
          if (pBVar26 == (BIO *)0x0) {
            uVar31 = ERR_get_error();
            pcVar18 = ossl_strerror(uVar31,(char *)&psigtype_nid,0x100);
            pcVar19 = "BIO_new return NULL, OpenSSL error %s";
            goto LAB_0052af65;
          }
          lVar32 = BIO_ctrl(pBVar26,0x6c,3,psVar24->issuercert);
          if ((int)lVar32 < 1) {
            if ((bVar2 & 3) != 0) {
              Curl_failf(data,"SSL: Unable to open issuer cert (%s)",psVar24->issuercert);
            }
            BIO_free(pBVar26);
            goto LAB_0052a7ea;
          }
LAB_0052a6c5:
          pXVar27 = PEM_read_bio_X509(pBVar26,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
          if (pXVar27 == (X509 *)0x0) {
            if ((bVar2 & 3) != 0) {
              Curl_failf(data,"SSL: Unable to read issuer cert (%s)",psVar24->issuercert);
            }
            BIO_free(pBVar26);
            pXVar27 = (X509 *)0x0;
          }
          else {
            iVar9 = X509_check_issued(pXVar27,*(X509 **)(lVar17 + 0x10));
            if (iVar9 == 0) {
              if (((data->set).field_0x8bd & 0x10) != 0) {
                Curl_infof(data," SSL certificate issuer check ok (%s)",psVar24->issuercert);
              }
              BIO_free(pBVar26);
              X509_free(pXVar27);
              goto LAB_0052a857;
            }
            if ((bVar2 & 3) != 0) {
              Curl_failf(data,"SSL: Certificate issuer check failed (%s)",psVar24->issuercert);
            }
            BIO_free(pBVar26);
          }
          X509_free(pXVar27);
LAB_0052a7ea:
          X509_free(*(X509 **)(lVar17 + 0x10));
          *(undefined8 *)(lVar17 + 0x10) = 0;
          return CURLE_SSL_ISSUER_ERROR;
        }
        if (pcVar5 != (curl_blob *)0x0) {
LAB_0052a6ae:
          pBVar26 = BIO_new_mem_buf(pcVar5->data,(int)pcVar5->len);
          if (pBVar26 == (BIO *)0x0) {
            uVar31 = ERR_get_error();
            pcVar18 = ossl_strerror(uVar31,(char *)&psigtype_nid,0x100);
            pcVar19 = "BIO_new_mem_buf NULL, OpenSSL error %s";
LAB_0052af65:
            Curl_failf(data,pcVar19,pcVar18);
            X509_free(*(X509 **)(lVar17 + 0x10));
            *(undefined8 *)(lVar17 + 0x10) = 0;
            return CURLE_OUT_OF_MEMORY;
          }
          goto LAB_0052a6c5;
        }
LAB_0052a857:
        lVar32 = SSL_get_verify_result(*(SSL **)(lVar17 + 8));
        psVar16->certverifyresult = lVar32;
        if (lVar32 == 0) {
          if (((data->set).field_0x8bd & 0x10) == 0) {
LAB_0052af37:
            local_a84 = CURLE_OK;
          }
          else {
            local_a84 = CURLE_OK;
            Curl_infof(data," SSL certificate verify ok.");
          }
        }
        else if ((psVar24->field_0x69 & 1) == 0) {
          if (((data->set).field_0x8bd & 0x10) == 0) goto LAB_0052af37;
          pcVar18 = X509_verify_cert_error_string(lVar32);
          local_a84 = CURLE_OK;
          Curl_infof(data," SSL certificate verify result: %s (%ld), continuing anyway.",pcVar18);
        }
        else if ((bVar2 & 3) != 0) {
          pcVar18 = X509_verify_cert_error_string(lVar32);
          Curl_failf(data,"SSL certificate verify result: %s (%ld)",pcVar18);
        }
      }
      else if ((bVar2 & 3) != 0) {
        Curl_failf(data,"SSL: couldn\'t get X509-issuer name");
      }
      pSVar38 = *(SSL **)(lVar17 + 8);
      lVar32 = SSL_get_verify_result(pSVar38);
      if (lVar32 == 0) {
        psVar33 = (stack_st_X509 *)SSL_get0_verified_chain();
      }
      else {
        psVar33 = SSL_get_peer_cert_chain(pSVar38);
      }
      uVar11 = OPENSSL_sk_num(psVar33);
      if ((int)uVar11 < 1) {
        uVar11 = 0;
      }
      for (uVar40 = 0; uVar11 != uVar40; uVar40 = uVar40 + 1) {
        local_9e8 = 0;
        uStack_9e0 = 0;
        local_9f8 = 0;
        uStack_9f0 = 0;
        local_a08 = 0;
        uStack_a00 = 0;
        local_a18 = 0;
        uStack_a10 = 0;
        ssl_sessionid = (void *)0x0;
        uStack_a20 = 0;
        group_name_final[0x40] = '\0';
        group_name_final[0x41] = '\0';
        group_name_final[0x42] = '\0';
        group_name_final[0x43] = '\0';
        group_name_final[0x44] = '\0';
        group_name_final[0x45] = '\0';
        group_name_final[0x46] = '\0';
        group_name_final[0x47] = '\0';
        group_name_final[0x48] = '\0';
        group_name_final[0x49] = '\0';
        group_name_final[0x4a] = '\0';
        group_name_final[0x4b] = '\0';
        group_name_final[0x4c] = '\0';
        group_name_final[0x4d] = '\0';
        group_name_final[0x4e] = '\0';
        group_name_final[0x4f] = '\0';
        group_name_final[0x30] = '\0';
        group_name_final[0x31] = '\0';
        group_name_final[0x32] = '\0';
        group_name_final[0x33] = '\0';
        group_name_final[0x34] = '\0';
        group_name_final[0x35] = '\0';
        group_name_final[0x36] = '\0';
        group_name_final[0x37] = '\0';
        group_name_final[0x38] = '\0';
        group_name_final[0x39] = '\0';
        group_name_final[0x3a] = '\0';
        group_name_final[0x3b] = '\0';
        group_name_final[0x3c] = '\0';
        group_name_final[0x3d] = '\0';
        group_name_final[0x3e] = '\0';
        group_name_final[0x3f] = '\0';
        group_name_final[0x20] = '\0';
        group_name_final[0x21] = '\0';
        group_name_final[0x22] = '\0';
        group_name_final[0x23] = '\0';
        group_name_final[0x24] = '\0';
        group_name_final[0x25] = '\0';
        group_name_final[0x26] = '\0';
        group_name_final[0x27] = '\0';
        group_name_final[0x28] = '\0';
        group_name_final[0x29] = '\0';
        group_name_final[0x2a] = '\0';
        group_name_final[0x2b] = '\0';
        group_name_final[0x2c] = '\0';
        group_name_final[0x2d] = '\0';
        group_name_final[0x2e] = '\0';
        group_name_final[0x2f] = '\0';
        group_name_final[0x10] = '\0';
        group_name_final[0x11] = '\0';
        group_name_final[0x12] = '\0';
        group_name_final[0x13] = '\0';
        group_name_final[0x14] = '\0';
        group_name_final[0x15] = '\0';
        group_name_final[0x16] = '\0';
        group_name_final[0x17] = '\0';
        group_name_final[0x18] = '\0';
        group_name_final[0x19] = '\0';
        group_name_final[0x1a] = '\0';
        group_name_final[0x1b] = '\0';
        group_name_final[0x1c] = '\0';
        group_name_final[0x1d] = '\0';
        group_name_final[0x1e] = '\0';
        group_name_final[0x1f] = '\0';
        palg_cert = (X509_ALGOR *)0x0;
        group_name_final[0] = '\0';
        group_name_final[1] = '\0';
        group_name_final[2] = '\0';
        group_name_final[3] = '\0';
        group_name_final[4] = '\0';
        group_name_final[5] = '\0';
        group_name_final[6] = '\0';
        group_name_final[7] = '\0';
        group_name_final[8] = '\0';
        group_name_final[9] = '\0';
        group_name_final[10] = '\0';
        group_name_final[0xb] = '\0';
        group_name_final[0xc] = '\0';
        group_name_final[0xd] = '\0';
        group_name_final[0xe] = '\0';
        group_name_final[0xf] = '\0';
        paobj_cert = (ASN1_OBJECT *)0x0;
        uVar34 = OPENSSL_sk_value(psVar33,uVar40);
        X509_get0_signature(0,&palg_cert,uVar34);
        X509_ALGOR_get0((ASN1_OBJECT **)&paobj_cert,(int *)0x0,(void **)0x0,(X509_ALGOR *)palg_cert)
        ;
        OBJ_obj2txt((char *)&ssl_sessionid,0x50,(ASN1_OBJECT *)paobj_cert,0);
        uVar34 = X509_get0_pubkey(uVar34);
        uVar12 = EVP_PKEY_get_bits(uVar34);
        uVar13 = EVP_PKEY_get_security_bits(uVar34);
        local_948 = 0;
        uStack_940 = 0;
        local_958 = 0;
        uStack_950 = 0;
        local_968 = 0;
        uStack_960 = 0;
        local_978 = 0;
        uStack_970 = 0;
        rev = (ASN1_GENERALIZEDTIME *)0x0;
        uStack_980 = 0;
        iVar9 = EVP_PKEY_get_group_name(uVar34,&rev,0x50,0);
        curl_msnprintf(group_name_final,0x50,"/%s",&rev);
        pcVar18 = (char *)EVP_PKEY_get0_type_name(uVar34);
        if (((data->set).field_0x8bd & 0x10) != 0) {
          if (pcVar18 == (char *)0x0) {
            pcVar18 = "?";
          }
          pcVar19 = group_name_final;
          if (iVar9 == 0) {
            pcVar19 = "";
          }
          in_stack_fffffffffffff538 =
               (curl_blob *)CONCAT44((int)((ulong)in_stack_fffffffffffff538 >> 0x20),uVar13);
          Curl_infof(data,
                     "  Certificate level %d: Public key type %s%s (%d/%d Bits/secBits), signed using %s"
                     ,(ulong)uVar40,pcVar18,pcVar19,uVar12,in_stack_fffffffffffff538,&ssl_sessionid)
          ;
        }
      }
      if (((psVar24->field_0x69 & 4) != 0) && ((*(byte *)((long)pvVar39 + 0x54) & 2) == 0)) {
        puVar3 = *(undefined8 **)((long)cf->ctx + 0x30);
        lVar32 = SSL_ctrl((SSL *)puVar3[1],0x46,0,&ssl_sessionid);
        if (ssl_sessionid == (void *)0x0) {
          pcVar18 = "No OCSP response received";
LAB_0052a8cc:
          resp = (OCSP_RESPONSE *)0x0;
          Curl_failf(data,pcVar18);
          CVar10 = CURLE_SSL_INVALIDCERTSTATUS;
        }
        else {
          group_name_final._0_8_ = ssl_sessionid;
          resp = d2i_OCSP_RESPONSE((OCSP_RESPONSE **)0x0,(uchar **)group_name_final,lVar32);
          if (resp == (OCSP_RESPONSE *)0x0) {
            pcVar18 = "Invalid OCSP response";
            goto LAB_0052a8cc;
          }
          iVar9 = OCSP_response_status(resp);
          if (iVar9 == 0) {
            bs = OCSP_response_get1_basic(resp);
            if (bs == (OCSP_BASICRESP *)0x0) {
              Curl_failf(data,"Invalid OCSP response");
              goto LAB_0052a527;
            }
            psVar33 = SSL_get_peer_cert_chain((SSL *)puVar3[1]);
            if (psVar33 == (stack_st_X509 *)0x0) {
              pcVar18 = "Could not get peer certificate chain";
LAB_0052b265:
              Curl_failf(data,pcVar18);
LAB_0052b26f:
              CVar10 = CURLE_SSL_INVALIDCERTSTATUS;
            }
            else {
              st = SSL_CTX_get_cert_store((SSL_CTX *)*puVar3);
              iVar9 = OCSP_basic_verify(bs,psVar33,st,0);
              if (iVar9 < 1) {
                pcVar18 = "OCSP response verification failed";
                goto LAB_0052b265;
              }
              pXVar27 = (X509 *)SSL_get1_peer_certificate(puVar3[1]);
              if (pXVar27 == (X509 *)0x0) {
                pcVar18 = "Error getting peer certificate";
                goto LAB_0052b265;
              }
              id = (OCSP_CERTID *)0x0;
              iVar9 = 0;
              do {
                iVar14 = OPENSSL_sk_num(psVar33);
                if (iVar14 <= iVar9) goto LAB_0052b075;
                issuer = (X509 *)OPENSSL_sk_value(psVar33,iVar9);
                iVar14 = X509_check_issued(issuer,pXVar27);
                iVar9 = iVar9 + 1;
              } while (iVar14 != 0);
              dgst = EVP_sha1();
              id = OCSP_cert_to_id(dgst,pXVar27,issuer);
LAB_0052b075:
              X509_free(pXVar27);
              if (id == (OCSP_CERTID *)0x0) {
                pcVar18 = "Error computing OCSP ID";
                goto LAB_0052b265;
              }
              iVar9 = OCSP_resp_find_status
                                (bs,id,&cert_status,&crl_reason,(ASN1_GENERALIZEDTIME **)&rev,
                                 (ASN1_GENERALIZEDTIME **)&palg_cert,
                                 (ASN1_GENERALIZEDTIME **)&paobj_cert);
              OCSP_CERTID_free(id);
              if (iVar9 != 1) {
                pcVar18 = "Could not find certificate ID in OCSP response";
                goto LAB_0052b265;
              }
              iVar9 = OCSP_check_validity((ASN1_GENERALIZEDTIME *)palg_cert,
                                          (ASN1_GENERALIZEDTIME *)paobj_cert,300,-1);
              if (iVar9 == 0) {
                pcVar18 = "OCSP response has expired";
                goto LAB_0052b265;
              }
              if (((data->set).field_0x8bd & 0x10) != 0) {
                pcVar18 = OCSP_cert_status_str((long)cert_status);
                Curl_infof(data,"SSL certificate status: %s (%d)",pcVar18);
              }
              CVar10 = cert_status;
              if (cert_status != 0) {
                if (cert_status != 1) {
                  CVar10 = CURLE_SSL_INVALIDCERTSTATUS;
                  goto LAB_0052b272;
                }
                pcVar18 = OCSP_crl_reason_str((long)crl_reason);
                Curl_failf(data,"SSL certificate revocation reason: %s (%d)",pcVar18);
                goto LAB_0052b26f;
              }
            }
LAB_0052b272:
            OCSP_BASICRESP_free(bs);
          }
          else {
            pcVar18 = OCSP_response_status_str((long)iVar9);
            Curl_failf(data,"Invalid OCSP response status: %s (%d)",pcVar18);
LAB_0052a527:
            CVar10 = CURLE_SSL_INVALIDCERTSTATUS;
          }
        }
        OCSP_RESPONSE_free(resp);
        if (CVar10 != CURLE_OK) {
          _Var7 = Curl_ssl_cf_is_proxy(cf);
          if (!_Var7) {
            ssl_sessionid = (void *)0x0;
            Curl_ssl_sessionid_lock(data);
            _Var7 = Curl_ssl_getsessionid(cf,data,&ssl_sessionid,(size_t *)0x0);
            if (!_Var7) {
              if (((data->set).field_0x8bd & 0x10) != 0) {
                Curl_infof(data,"Remove session ID again from cache");
              }
              Curl_ssl_delsessionid(data,ssl_sessionid);
            }
            Curl_ssl_sessionid_unlock(data);
          }
          X509_free(*(X509 **)(lVar17 + 0x10));
          *(undefined8 *)(lVar17 + 0x10) = 0;
          return CVar10;
        }
        local_a84 = CURLE_OK;
      }
      CVar10 = CURLE_OK;
      if ((bVar2 & 3) != 0) {
        CVar10 = local_a84;
      }
      _Var7 = Curl_ssl_cf_is_proxy(cf);
      pcVar18 = (data->set).str[(ulong)_Var7 + 0x1e];
      ptr = pcVar18;
      if (pcVar18 != (char *)0x0 && CVar10 == CURLE_OK) {
        lVar32 = *(long *)(lVar17 + 0x10);
        if (lVar32 == 0) {
LAB_0052aa68:
          CVar10 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
        }
        else {
          pXVar37 = (X509_PUBKEY *)X509_get_X509_PUBKEY(lVar32);
          uVar11 = i2d_X509_PUBKEY(pXVar37,(uchar **)0x0);
          if ((int)uVar11 < 1) goto LAB_0052aa68;
          uVar31 = (ulong)uVar11;
          pubkey = (uchar *)(*Curl_cmalloc)(uVar31);
          ssl_sessionid = pubkey;
          if (pubkey == (uchar *)0x0) goto LAB_0052aa68;
          pXVar37 = (X509_PUBKEY *)X509_get_X509_PUBKEY(lVar32);
          uVar40 = i2d_X509_PUBKEY(pXVar37,(uchar **)&ssl_sessionid);
          if ((ssl_sessionid == (void *)0x0 || uVar11 != uVar40) ||
              (long)ssl_sessionid - (long)pubkey != uVar31) {
            CVar10 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
          }
          else {
            CVar10 = Curl_pin_peer_pubkey(data,pcVar18,pubkey,uVar31);
          }
          (*Curl_cfree)(pubkey);
          if (CVar10 == CURLE_OK) {
            CVar10 = CURLE_OK;
            goto LAB_0052aa86;
          }
        }
        Curl_failf(data,"SSL: public key does not match pinned public key");
      }
LAB_0052aa86:
      X509_free(*(X509 **)(lVar17 + 0x10));
      *(undefined8 *)(lVar17 + 0x10) = 0;
      *(undefined4 *)((long)pvVar39 + 4) = 5;
      if (CVar10 != CURLE_OK) {
        return CVar10;
      }
    }
    *(undefined4 *)((long)local_a58 + 4) = 5;
    iVar9 = piVar36[1];
  }
  if (iVar9 == 5) {
    *piVar36 = 2;
  }
  *local_a30 = iVar9 == 5;
  piVar36[1] = 0;
  return CURLE_OK;
}

Assistant:

static CURLcode ossl_connect_common(struct Curl_cfilter *cf,
                                    struct Curl_easy *data,
                                    bool nonblocking,
                                    bool *done)
{
  CURLcode result = CURLE_OK;
  struct ssl_connect_data *connssl = cf->ctx;
  curl_socket_t sockfd = Curl_conn_cf_get_socket(cf, data);
  int what;

  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(ssl_connect_1 == connssl->connecting_state) {
    /* Find out how much more time we're allowed */
    const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time is already up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    result = ossl_connect_step1(cf, data);
    if(result)
      goto out;
  }

  while(ssl_connect_2 == connssl->connecting_state ||
        ssl_connect_2_reading == connssl->connecting_state ||
        ssl_connect_2_writing == connssl->connecting_state) {

    /* check allowed time left */
    const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      result = CURLE_OPERATION_TIMEDOUT;
      goto out;
    }

    /* if ssl is expecting something, check if it's available. */
    if(!nonblocking &&
       (connssl->connecting_state == ssl_connect_2_reading ||
        connssl->connecting_state == ssl_connect_2_writing)) {

      curl_socket_t writefd = ssl_connect_2_writing ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;
      curl_socket_t readfd = ssl_connect_2_reading ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;

      what = Curl_socket_check(readfd, CURL_SOCKET_BAD, writefd,
                               timeout_ms);
      if(what < 0) {
        /* fatal error */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        result = CURLE_SSL_CONNECT_ERROR;
        goto out;
      }
      if(0 == what) {
        /* timeout */
        failf(data, "SSL connection timeout");
        result = CURLE_OPERATION_TIMEDOUT;
        goto out;
      }
      /* socket is readable or writable */
    }

    /* Run transaction, and return to the caller if it failed or if this
     * connection is done nonblocking and this loop would execute again. This
     * permits the owner of a multi handle to abort a connection attempt
     * before step2 has completed while ensuring that a client using select()
     * or epoll() will always have a valid fdset to wait on.
     */
    result = ossl_connect_step2(cf, data);
    if(result || (nonblocking &&
                  (ssl_connect_2 == connssl->connecting_state ||
                   ssl_connect_2_reading == connssl->connecting_state ||
                   ssl_connect_2_writing == connssl->connecting_state)))
      goto out;

  } /* repeat step2 until all transactions are done. */

  if(ssl_connect_3 == connssl->connecting_state) {
    result = ossl_connect_step3(cf, data);
    if(result)
      goto out;
  }

  if(ssl_connect_done == connssl->connecting_state) {
    connssl->state = ssl_connection_complete;
    *done = TRUE;
  }
  else
    *done = FALSE;

  /* Reset our connect state machine */
  connssl->connecting_state = ssl_connect_1;

out:
  return result;
}